

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,char_type *value)

{
  size_t in_RCX;
  void *in_RDX;
  cstring_spec_handler local_18;
  
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value,in_RDX,in_RCX);
  }
  else {
    local_18.formatter = this;
    local_18.value = value;
    handle_cstring_type_spec<char,fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::cstring_spec_handler>
              (this->specs_->type,&local_18);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type* value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(specs_->type,
                                       cstring_spec_handler(*this, value));
    return out();
  }